

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageLoader.cpp
# Opt level: O2

bool __thiscall
sf::priv::ImageLoader::loadImageFromMemory
          (ImageLoader *this,void *data,size_t dataSize,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *pixels,Vector2u *size)

{
  pointer puVar1;
  stbi_uc *__src;
  ostream *poVar2;
  bool bVar3;
  long in_FS_OFFSET;
  int height;
  int width;
  int channels;
  
  if (dataSize == 0 || data == (void *)0x0) {
    poVar2 = err();
    poVar2 = std::operator<<(poVar2,"Failed to load image from memory, no data provided");
    std::endl<char,std::char_traits<char>>(poVar2);
    bVar3 = false;
  }
  else {
    puVar1 = (pixels->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((pixels->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish != puVar1) {
      (pixels->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish = puVar1;
    }
    width = 0;
    height = 0;
    channels = 0;
    __src = stbi_load_from_memory((stbi_uc *)data,(int)dataSize,&width,&height,&channels,4);
    bVar3 = __src != (stbi_uc *)0x0;
    if (__src == (stbi_uc *)0x0) {
      poVar2 = err();
      poVar2 = std::operator<<(poVar2,"Failed to load image from memory. Reason: ");
      poVar2 = std::operator<<(poVar2,*(char **)(in_FS_OFFSET + -0x68));
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    else {
      size->x = width;
      size->y = height;
      if (0 < height && 0 < width) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (pixels,(ulong)(uint)(width * height * 4));
        puVar1 = (pixels->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        memcpy(puVar1,__src,
               (long)(pixels->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)puVar1);
      }
      free(__src);
    }
  }
  return bVar3;
}

Assistant:

bool ImageLoader::loadImageFromMemory(const void* data, std::size_t dataSize, std::vector<Uint8>& pixels, Vector2u& size)
{
    // Check input parameters
    if (data && dataSize)
    {
        // Clear the array (just in case)
        pixels.clear();

        // Load the image and get a pointer to the pixels in memory
        int width = 0;
        int height = 0;
        int channels = 0;
        const unsigned char* buffer = static_cast<const unsigned char*>(data);
        unsigned char* ptr = stbi_load_from_memory(buffer, static_cast<int>(dataSize), &width, &height, &channels, STBI_rgb_alpha);

        if (ptr)
        {
            // Assign the image properties
            size.x = static_cast<unsigned int>(width);
            size.y = static_cast<unsigned int>(height);

            if (width > 0 && height > 0)
            {
                // Copy the loaded pixels to the pixel buffer
                pixels.resize(static_cast<std::size_t>(width * height * 4));
                memcpy(&pixels[0], ptr, pixels.size());
            }

            // Free the loaded pixels (they are now in our own pixel buffer)
            stbi_image_free(ptr);

            return true;
        }
        else
        {
            // Error, failed to load the image
            err() << "Failed to load image from memory. Reason: " << stbi_failure_reason() << std::endl;

            return false;
        }
    }
    else
    {
        err() << "Failed to load image from memory, no data provided" << std::endl;
        return false;
    }
}